

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_if_feature
               (lyout *out,lys_module *module,lys_iffeature *iffeature,uint8_t iffeature_size)

{
  int local_28;
  int i;
  uint8_t iffeature_size_local;
  lys_iffeature *iffeature_local;
  lys_module *module_local;
  lyout *out_local;
  
  ly_print(out,"%-*s",0xb,"If-feats: ");
  if (iffeature_size == '\0') {
    ly_print(out,"\n");
  }
  else {
    ly_print_iffeature(out,module,iffeature,1);
    ly_print(out,"\n");
    for (local_28 = 1; local_28 < (int)(uint)iffeature_size; local_28 = local_28 + 1) {
      ly_print(out,"%*s",0xb,"");
      ly_print_iffeature(out,module,iffeature + local_28,1);
      ly_print(out,"\n");
    }
  }
  return;
}

Assistant:

static void
info_print_if_feature(struct lyout *out, const struct lys_module *module,
                      struct lys_iffeature *iffeature, uint8_t iffeature_size)
{
    int i;

    ly_print(out, "%-*s", INDENT_LEN, "If-feats: ");

    if (iffeature_size) {
        ly_print_iffeature(out, module, &iffeature[0], 1);
        ly_print(out, "\n");
        for (i = 1; i < iffeature_size; ++i) {
            ly_print(out, "%*s", INDENT_LEN, "");
            ly_print_iffeature(out, module, &iffeature[i], 1);
            ly_print(out, "\n");
        }
    } else {
        ly_print(out, "\n");
    }
}